

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stl_bind.h
# Opt level: O0

void pybind11::detail::
     vector_if_equal_operator<std::vector<unsigned_long,std::allocator<unsigned_long>>,pybind11::class_<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::unique_ptr<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::default_delete<std::vector<unsigned_long,std::allocator<unsigned_long>>>>>>
               (enable_if_t<is_comparable<vector<unsigned_long>_>::value,_pybind11::class_<std::vector<unsigned_long>,_std::unique_ptr<std::vector<unsigned_long>_>_>_>
                *cl)

{
  op_<(pybind11::detail::op_id)25,_(pybind11::detail::op_type)0,_pybind11::detail::self_t,_pybind11::detail::self_t>
  *in_RDI;
  type *unaff_retaddr;
  char *in_stack_00000008;
  class_<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::unique_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::default_delete<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
  *in_stack_00000010;
  class_<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::unique_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::default_delete<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
  *in_stack_ffffffffffffff90;
  op_<(pybind11::detail::op_id)25,_(pybind11::detail::op_type)0,_pybind11::detail::self_t,_pybind11::detail::self_t>
  *this;
  arg local_50;
  arg local_38;
  arg local_20;
  char (*in_stack_fffffffffffffff0) [95];
  op_<(pybind11::detail::op_id)25,_(pybind11::detail::op_type)0,_pybind11::detail::self_t,_pybind11::detail::self_t>
  *extra;
  
  this = in_RDI;
  operator==((self_t *)&self,(self_t *)&self);
  class_<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::unique_ptr<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::default_delete<std::vector<unsigned_long,std::allocator<unsigned_long>>>>>
  ::
  def<(pybind11::detail::op_id)25,(pybind11::detail::op_type)0,pybind11::detail::self_t,pybind11::detail::self_t>
            (in_stack_ffffffffffffff90,in_RDI);
  extra = this;
  operator!=((self_t *)&self,(self_t *)&self);
  class_<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::unique_ptr<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::default_delete<std::vector<unsigned_long,std::allocator<unsigned_long>>>>>
  ::
  def<(pybind11::detail::op_id)26,(pybind11::detail::op_type)0,pybind11::detail::self_t,pybind11::detail::self_t>
            ((class_<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::unique_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::default_delete<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
              *)this,(op_<(pybind11::detail::op_id)26,_(pybind11::detail::op_type)0,_pybind11::detail::self_t,_pybind11::detail::self_t>
                      *)in_RDI);
  pybind11::arg::arg(&local_20,"x");
  class_<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::unique_ptr<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::default_delete<std::vector<unsigned_long,std::allocator<unsigned_long>>>>>
  ::
  def<pybind11::detail::vector_if_equal_operator<std::vector<unsigned_long,std::allocator<unsigned_long>>,pybind11::class_<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::unique_ptr<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::default_delete<std::vector<unsigned_long,std::allocator<unsigned_long>>>>>>(std::enable_if<is_comparable<std::vector<unsigned_long,std::allocator<unsigned_long>>>::value,pybind11::class_<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::unique_ptr<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::default_delete<std::vector<unsigned_long,std::allocator<unsigned_long>>>>>>::type&)::_lambda(std::vector<unsigned_long,std::allocator<unsigned_long>>const&,unsigned_long_const&)_1_,pybind11::arg,char[53]>
            (in_stack_00000010,in_stack_00000008,(type *)unaff_retaddr,(arg *)extra,
             (char (*) [53])in_stack_fffffffffffffff0);
  pybind11::arg::arg(&local_38,"x");
  class_<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::unique_ptr<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::default_delete<std::vector<unsigned_long,std::allocator<unsigned_long>>>>>
  ::
  def<pybind11::detail::vector_if_equal_operator<std::vector<unsigned_long,std::allocator<unsigned_long>>,pybind11::class_<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::unique_ptr<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::default_delete<std::vector<unsigned_long,std::allocator<unsigned_long>>>>>>(std::enable_if<is_comparable<std::vector<unsigned_long,std::allocator<unsigned_long>>>::value,pybind11::class_<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::unique_ptr<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::default_delete<std::vector<unsigned_long,std::allocator<unsigned_long>>>>>>::type&)::_lambda(std::vector<unsigned_long,std::allocator<unsigned_long>>&,unsigned_long_const&)_1_,pybind11::arg,char[95]>
            (in_stack_00000010,in_stack_00000008,(type *)unaff_retaddr,(arg *)extra,
             in_stack_fffffffffffffff0);
  pybind11::arg::arg(&local_50,"x");
  class_<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::unique_ptr<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::default_delete<std::vector<unsigned_long,std::allocator<unsigned_long>>>>>
  ::
  def<pybind11::detail::vector_if_equal_operator<std::vector<unsigned_long,std::allocator<unsigned_long>>,pybind11::class_<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::unique_ptr<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::default_delete<std::vector<unsigned_long,std::allocator<unsigned_long>>>>>>(std::enable_if<is_comparable<std::vector<unsigned_long,std::allocator<unsigned_long>>>::value,pybind11::class_<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::unique_ptr<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::default_delete<std::vector<unsigned_long,std::allocator<unsigned_long>>>>>>::type&)::_lambda(std::vector<unsigned_long,std::allocator<unsigned_long>>const&,unsigned_long_const&)_2_,pybind11::arg,char[41]>
            (in_stack_00000010,in_stack_00000008,unaff_retaddr,(arg *)extra,
             (char (*) [41])in_stack_fffffffffffffff0);
  return;
}

Assistant:

void vector_if_equal_operator(enable_if_t<is_comparable<Vector>::value, Class_> &cl) {
    using T = typename Vector::value_type;

    cl.def(self == self);
    cl.def(self != self);

    cl.def("count",
        [](const Vector &v, const T &x) {
            return std::count(v.begin(), v.end(), x);
        },
        arg("x"),
        "Return the number of times ``x`` appears in the list"
    );

    cl.def("remove", [](Vector &v, const T &x) {
            auto p = std::find(v.begin(), v.end(), x);
            if (p != v.end())
                v.erase(p);
            else
                throw value_error();
        },
        arg("x"),
        "Remove the first item from the list whose value is x. "
        "It is an error if there is no such item."
    );

    cl.def("__contains__",
        [](const Vector &v, const T &x) {
            return std::find(v.begin(), v.end(), x) != v.end();
        },
        arg("x"),
        "Return true the container contains ``x``"
    );
}